

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O0

void RunDeadAlocaStoreElimination(ExpressionContext *ctx,VmModule *module,VmValue *value)

{
  VmInstruction *instruction;
  bool bVar1;
  uint uVar2;
  VmValue **ppVVar3;
  VmInstruction *storeInst;
  uint storeCount;
  uint storePos;
  uint i;
  uint firstArgument;
  VmInstruction *inst;
  uint userUserCount;
  uint userUserPos;
  VmConstant *user;
  uint local_48;
  uint userCount;
  uint userPos;
  bool hasLoadUsers;
  VariableData *variable;
  uint variableCount;
  uint variablePos;
  ScopeData *scope;
  VmFunction *function;
  VmValue *value_local;
  VmModule *module_local;
  ExpressionContext *ctx_local;
  
  function = (VmFunction *)value;
  value_local = (VmValue *)module;
  module_local = (VmModule *)ctx;
  scope = (ScopeData *)getType<VmFunction>(value);
  if (((scope != (ScopeData *)0x0) &&
      (_variableCount = *(ScopeData **)&(scope->variables).count, _variableCount != (ScopeData *)0x0
      )) && (_variableCount != (ScopeData *)module_local[5].tempInstructions.little[0x5f])) {
    variable._4_4_ = 0;
    variable._0_4_ = (_variableCount->allVariables).count;
    for (; variable._4_4_ < (uint)variable; variable._4_4_ = variable._4_4_ + 1) {
      _userPos = (_variableCount->allVariables).data[variable._4_4_];
      if ((((_userPos->isAlloca & 1U) == 0) || ((_userPos->users).count != 0)) &&
         (bVar1 = HasAddressTaken(_userPos), !bVar1)) {
        userCount._3_1_ = 0;
        SmallArray<VmInstruction_*,_128U>::clear
                  ((SmallArray<VmInstruction_*,_128U> *)(value_local[0x1d].users.little + 3));
        local_48 = 0;
        user._4_4_ = (_userPos->users).count;
        for (; local_48 < user._4_4_; local_48 = local_48 + 1) {
          _userUserCount = (_userPos->users).data[local_48];
          inst._4_4_ = 0;
          inst._0_4_ = (_userUserCount->super_VmValue).users.count;
          for (; inst._4_4_ < (uint)inst; inst._4_4_ = inst._4_4_ + 1) {
            _i = getType<VmInstruction>((_userUserCount->super_VmValue).users.data[inst._4_4_]);
            if (_i != (VmInstruction *)0x0) {
              if ((-1 < (int)_i->cmd) && ((int)_i->cmd < 7)) {
                userCount._3_1_ = 1;
              }
              if (((7 < (int)_i->cmd) && ((int)_i->cmd < 0xf)) &&
                 (ppVVar3 = SmallArray<VmValue_*,_4U>::operator[](&_i->arguments,0),
                 (VmConstant *)*ppVVar3 == _userUserCount)) {
                SmallArray<VmInstruction_*,_128U>::push_back
                          ((SmallArray<VmInstruction_*,_128U> *)(value_local[0x1d].users.little + 3)
                           ,(VmInstruction **)&i);
              }
              if ((_i->cmd == VM_INST_MEM_COPY) &&
                 (ppVVar3 = SmallArray<VmValue_*,_4U>::operator[](&_i->arguments,0),
                 (VmConstant *)*ppVVar3 == _userUserCount)) {
                SmallArray<VmInstruction_*,_128U>::push_back
                          ((SmallArray<VmInstruction_*,_128U> *)(value_local[0x1d].users.little + 3)
                           ,(VmInstruction **)&i);
              }
              if ((_i->cmd == VM_INST_MEM_COPY) &&
                 (ppVVar3 = SmallArray<VmValue_*,_4U>::operator[](&_i->arguments,2),
                 (VmConstant *)*ppVVar3 == _userUserCount)) {
                userCount._3_1_ = 1;
              }
              if ((_i->cmd == VM_INST_RETURN) && ((_userUserCount->isReference & 1U) != 0)) {
                userCount._3_1_ = 1;
              }
              if ((_i->cmd == VM_INST_CALL) && ((_userUserCount->isReference & 1U) != 0)) {
                storePos = 3;
                ppVVar3 = SmallArray<VmValue_*,_4U>::operator[](&_i->arguments,0);
                if (((*ppVVar3)->type).type == VM_TYPE_FUNCTION_REF) {
                  storePos = 2;
                }
                for (storeCount = storePos; uVar2 = SmallArray<VmValue_*,_4U>::size(&_i->arguments),
                    storeCount < uVar2; storeCount = storeCount + 1) {
                  ppVVar3 = SmallArray<VmValue_*,_4U>::operator[](&_i->arguments,storeCount);
                  if ((VmConstant *)*ppVVar3 == _userUserCount) {
                    userCount._3_1_ = 1;
                  }
                }
              }
              if ((0x32 < (int)_i->cmd) && ((int)_i->cmd < 0x44)) {
                userCount._3_1_ = 1;
              }
            }
          }
        }
        if (((userCount._3_1_ & 1) == 0) && (*(int *)(value_local[0x1d].users.little + 4) != 0)) {
          storeInst._4_4_ = 0;
          uVar2 = *(uint *)(value_local[0x1d].users.little + 4);
          for (; storeInst._4_4_ < uVar2; storeInst._4_4_ = storeInst._4_4_ + 1) {
            instruction = (VmInstruction *)
                          (value_local[0x1d].users.little[3]->users).little
                          [(ulong)storeInst._4_4_ - 10];
            value_local[4].typeID = value_local[4].typeID + 1;
            VmBlock::RemoveInstruction(instruction->parent,instruction);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void RunDeadAlocaStoreElimination(ExpressionContext &ctx, VmModule *module, VmValue* value)
{
	if(VmFunction *function = getType<VmFunction>(value))
	{
		if(ScopeData *scope = function->scope)
		{
			// Keep stores to globals
			if(scope == ctx.globalScope)
				return;

			for(unsigned variablePos = 0, variableCount = scope->allVariables.count; variablePos < variableCount; variablePos++)
			{
				VariableData *variable = scope->allVariables.data[variablePos];

				if(variable->isAlloca && variable->users.count == 0)
					continue;

				if(HasAddressTaken(variable))
					continue;

				bool hasLoadUsers = false;

				module->tempInstructions.clear();

				for(unsigned userPos = 0, userCount = variable->users.count; userPos < userCount; userPos++)
				{
					VmConstant *user = variable->users.data[userPos];

					for(unsigned userUserPos = 0, userUserCount = user->users.count; userUserPos < userUserCount; userUserPos++)
					{
						if(VmInstruction *inst = getType<VmInstruction>(user->users.data[userUserPos]))
						{
							if(inst->cmd >= VM_INST_LOAD_BYTE && inst->cmd <= VM_INST_LOAD_STRUCT)
								hasLoadUsers = true;

							if(inst->cmd >= VM_INST_STORE_BYTE && inst->cmd <= VM_INST_STORE_STRUCT && inst->arguments[0] == user)
								module->tempInstructions.push_back(inst);

							if(inst->cmd == VM_INST_MEM_COPY && inst->arguments[0] == user)
								module->tempInstructions.push_back(inst);

							if(inst->cmd == VM_INST_MEM_COPY && inst->arguments[2] == user)
								hasLoadUsers = true;

							if(inst->cmd == VM_INST_RETURN && user->isReference)
								hasLoadUsers = true;

							if(inst->cmd == VM_INST_CALL && user->isReference)
							{
								unsigned firstArgument = 3;

								if(inst->arguments[0]->type.type == VM_TYPE_FUNCTION_REF)
									firstArgument = 2;

								for(unsigned i = firstArgument; i < inst->arguments.size(); i++)
								{
									if(inst->arguments[i] == user)
										hasLoadUsers = true;
								}
							}

							if(inst->cmd >= VM_INST_ADD_LOAD && inst->cmd <= VM_INST_BIT_XOR_LOAD)
								hasLoadUsers = true;
						}
					}
				}

				if(!hasLoadUsers && module->tempInstructions.count != 0)
				{
					for(unsigned storePos = 0, storeCount = module->tempInstructions.count; storePos < storeCount; storePos++)
					{
						VmInstruction *storeInst = module->tempInstructions.data[storePos];

						module->deadAllocaStoreEliminations++;

						storeInst->parent->RemoveInstruction(storeInst);
					}
				}
			}
		}
	}
}